

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  undefined4 uVar19;
  undefined8 uVar20;
  Scene *pSVar21;
  Geometry *pGVar22;
  RTCFilterFunctionN p_Var23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar32;
  int iVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar36;
  long lVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  AABBNodeMB4D *node1;
  ulong uVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  float fVar66;
  float fVar67;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar68;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar65;
  float fVar69;
  float fVar75;
  float fVar76;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar79;
  undefined1 auVar80 [16];
  float fVar85;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar86;
  uint uVar87;
  float fVar93;
  float fVar95;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar90;
  uint uVar94;
  uint uVar96;
  float fVar97;
  uint uVar98;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar99;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar114;
  float fVar115;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar112;
  float fVar116;
  undefined1 auVar113 [16];
  float fVar117;
  float fVar118;
  float fVar123;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar127 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar132 [16];
  float fVar136;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar137 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  vbool<4> valid;
  undefined1 local_1248 [16];
  undefined1 (*local_1230) [16];
  ulong local_1228;
  ulong local_1220;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  float local_1158 [4];
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar36 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar85 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar97 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar157 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar141 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar146 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar151 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar163 = fVar141 * 0.99999964;
  fVar117 = fVar146 * 0.99999964;
  fVar158 = fVar151 * 0.99999964;
  fVar141 = fVar141 * 1.0000004;
  fVar146 = fVar146 * 1.0000004;
  fVar151 = fVar151 * 1.0000004;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1220 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar39 = local_1220 ^ 0x10;
  iVar33 = (tray->tnear).field_0.i[k];
  auVar124._4_4_ = iVar33;
  auVar124._0_4_ = iVar33;
  auVar124._8_4_ = iVar33;
  auVar124._12_4_ = iVar33;
  iVar33 = (tray->tfar).field_0.i[k];
  auVar56._4_4_ = iVar33;
  auVar56._0_4_ = iVar33;
  auVar56._8_4_ = iVar33;
  auVar56._12_4_ = iVar33;
  local_1230 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_10a8 = fVar85;
  fStack_10a4 = fVar85;
  fStack_10a0 = fVar85;
  fStack_109c = fVar85;
  local_10b8 = fVar97;
  fStack_10b4 = fVar97;
  fStack_10b0 = fVar97;
  fStack_10ac = fVar97;
  local_10c8 = fVar157;
  fStack_10c4 = fVar157;
  fStack_10c0 = fVar157;
  fStack_10bc = fVar157;
  local_10d8 = fVar141;
  fStack_10d4 = fVar141;
  fStack_10d0 = fVar141;
  fStack_10cc = fVar141;
  local_10e8 = fVar146;
  fStack_10e4 = fVar146;
  fStack_10e0 = fVar146;
  fStack_10dc = fVar146;
  local_10f8 = fVar151;
  fStack_10f4 = fVar151;
  fStack_10f0 = fVar151;
  fStack_10ec = fVar151;
  local_1108 = fVar158;
  fStack_1104 = fVar158;
  fStack_1100 = fVar158;
  fStack_10fc = fVar158;
  local_1118 = fVar163;
  fStack_1114 = fVar163;
  fStack_1110 = fVar163;
  fStack_110c = fVar163;
  fVar129 = fVar151;
  fVar128 = fVar151;
  fVar126 = fVar151;
  fVar123 = fVar157;
  fVar118 = fVar157;
  fVar116 = fVar157;
  fVar115 = fVar97;
  fVar114 = fVar97;
  fVar107 = fVar97;
  fVar106 = fVar85;
  fVar105 = fVar85;
  fVar104 = fVar85;
  fVar103 = fVar163;
  fVar102 = fVar163;
  fVar99 = fVar163;
  fVar95 = fVar158;
  fVar93 = fVar158;
  fVar86 = fVar158;
  fVar76 = fVar146;
  fVar75 = fVar146;
  fVar69 = fVar146;
  fVar68 = fVar141;
  fVar67 = fVar141;
  fVar66 = fVar141;
LAB_0025e9e2:
  do {
    pSVar32 = pSVar36 + -1;
    pSVar36 = pSVar36 + -1;
    if ((float)pSVar32->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar32->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar44 = (pSVar36->ptr).ptr;
      while ((uVar44 & 8) == 0) {
        uVar42 = uVar44 & 0xfffffffffffffff0;
        fVar130 = *(float *)(ray + k * 4 + 0x70);
        pfVar8 = (float *)(uVar42 + 0x80 + uVar41);
        pfVar1 = (float *)(uVar42 + 0x20 + uVar41);
        auVar77._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar104) * fVar99;
        auVar77._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar105) * fVar102;
        auVar77._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar106) * fVar103;
        auVar77._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar85) * fVar163;
        auVar77 = maxps(auVar124,auVar77);
        pfVar8 = (float *)(uVar42 + 0x80 + local_1220);
        pfVar1 = (float *)(uVar42 + 0x20 + local_1220);
        auVar88._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar107) * fVar117;
        auVar88._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar114) * fVar117;
        auVar88._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar115) * fVar117;
        auVar88._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar97) * fVar117;
        pfVar8 = (float *)(uVar42 + 0x80 + uVar45);
        pfVar1 = (float *)(uVar42 + 0x20 + uVar45);
        auVar111._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar116) * fVar86;
        auVar111._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar118) * fVar93;
        auVar111._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar123) * fVar95;
        auVar111._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar157) * fVar158;
        auVar88 = maxps(auVar88,auVar111);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar77,auVar88);
        pfVar8 = (float *)(uVar42 + 0x80 + (uVar41 ^ 0x10));
        pfVar1 = (float *)(uVar42 + 0x20 + (uVar41 ^ 0x10));
        auVar120._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar104) * fVar66;
        auVar120._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar105) * fVar67;
        auVar120._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar106) * fVar68;
        auVar120._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar85) * fVar141;
        pfVar8 = (float *)(uVar42 + 0x80 + uVar39);
        pfVar1 = (float *)(uVar42 + 0x20 + uVar39);
        auVar108._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar107) * fVar69;
        auVar108._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar114) * fVar75;
        auVar108._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar115) * fVar76;
        auVar108._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar97) * fVar146;
        pfVar8 = (float *)(uVar42 + 0x80 + (uVar45 ^ 0x10));
        pfVar1 = (float *)(uVar42 + 0x20 + (uVar45 ^ 0x10));
        auVar110._0_4_ = ((*pfVar8 * fVar130 + *pfVar1) - fVar116) * fVar126;
        auVar110._4_4_ = ((pfVar8[1] * fVar130 + pfVar1[1]) - fVar118) * fVar128;
        auVar110._8_4_ = ((pfVar8[2] * fVar130 + pfVar1[2]) - fVar123) * fVar129;
        auVar110._12_4_ = ((pfVar8[3] * fVar130 + pfVar1[3]) - fVar157) * fVar151;
        auVar88 = minps(auVar108,auVar110);
        auVar77 = minps(auVar56,auVar120);
        auVar77 = minps(auVar77,auVar88);
        if (((uint)uVar44 & 7) == 6) {
          bVar24 = (fVar130 < *(float *)(uVar42 + 0xf0) && *(float *)(uVar42 + 0xe0) <= fVar130) &&
                   tNear.field_0._0_4_ <= auVar77._0_4_;
          bVar25 = (fVar130 < *(float *)(uVar42 + 0xf4) && *(float *)(uVar42 + 0xe4) <= fVar130) &&
                   tNear.field_0._4_4_ <= auVar77._4_4_;
          bVar26 = (fVar130 < *(float *)(uVar42 + 0xf8) && *(float *)(uVar42 + 0xe8) <= fVar130) &&
                   tNear.field_0._8_4_ <= auVar77._8_4_;
          bVar27 = (fVar130 < *(float *)(uVar42 + 0xfc) && *(float *)(uVar42 + 0xec) <= fVar130) &&
                   tNear.field_0._12_4_ <= auVar77._12_4_;
        }
        else {
          bVar24 = tNear.field_0._0_4_ <= auVar77._0_4_;
          bVar25 = tNear.field_0._4_4_ <= auVar77._4_4_;
          bVar26 = tNear.field_0._8_4_ <= auVar77._8_4_;
          bVar27 = tNear.field_0._12_4_ <= auVar77._12_4_;
        }
        auVar46._0_4_ = (uint)bVar24 * -0x80000000;
        auVar46._4_4_ = (uint)bVar25 * -0x80000000;
        auVar46._8_4_ = (uint)bVar26 * -0x80000000;
        auVar46._12_4_ = (uint)bVar27 * -0x80000000;
        uVar38 = movmskps((int)local_1220,auVar46);
        if (uVar38 == 0) {
          if (pSVar36 == stack) {
            return;
          }
          goto LAB_0025e9e2;
        }
        uVar38 = uVar38 & 0xff;
        lVar43 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
          }
        }
        uVar44 = *(ulong *)(uVar42 + lVar43 * 8);
        uVar38 = uVar38 - 1 & uVar38;
        if (uVar38 != 0) {
          uVar87 = tNear.field_0.i[lVar43];
          lVar43 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
            }
          }
          uVar40 = *(ulong *)(uVar42 + lVar43 * 8);
          uVar94 = tNear.field_0.i[lVar43];
          uVar38 = uVar38 - 1 & uVar38;
          if (uVar38 == 0) {
            if (uVar87 < uVar94) {
              (pSVar36->ptr).ptr = uVar40;
              pSVar36->dist = uVar94;
              pSVar36 = pSVar36 + 1;
            }
            else {
              (pSVar36->ptr).ptr = uVar44;
              pSVar36->dist = uVar87;
              pSVar36 = pSVar36 + 1;
              uVar44 = uVar40;
            }
          }
          else {
            auVar78._8_4_ = uVar87;
            auVar78._0_8_ = uVar44;
            auVar78._12_4_ = 0;
            auVar100._8_4_ = uVar94;
            auVar100._0_8_ = uVar40;
            auVar100._12_4_ = 0;
            lVar43 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
              }
            }
            uVar20 = *(undefined8 *)(uVar42 + lVar43 * 8);
            iVar33 = tNear.field_0.i[lVar43];
            auVar89._8_4_ = iVar33;
            auVar89._0_8_ = uVar20;
            auVar89._12_4_ = 0;
            auVar47._8_4_ = -(uint)((int)uVar87 < (int)uVar94);
            uVar38 = uVar38 - 1 & uVar38;
            if (uVar38 == 0) {
              auVar47._4_4_ = auVar47._8_4_;
              auVar47._0_4_ = auVar47._8_4_;
              auVar47._12_4_ = auVar47._8_4_;
              auVar109._8_4_ = uVar94;
              auVar109._0_8_ = uVar40;
              auVar109._12_4_ = 0;
              auVar110 = blendvps(auVar109,auVar78,auVar47);
              auVar77 = blendvps(auVar78,auVar100,auVar47);
              auVar48._8_4_ = -(uint)(auVar110._8_4_ < iVar33);
              auVar48._4_4_ = auVar48._8_4_;
              auVar48._0_4_ = auVar48._8_4_;
              auVar48._12_4_ = auVar48._8_4_;
              auVar101._8_4_ = iVar33;
              auVar101._0_8_ = uVar20;
              auVar101._12_4_ = 0;
              auVar88 = blendvps(auVar101,auVar110,auVar48);
              auVar110 = blendvps(auVar110,auVar89,auVar48);
              auVar49._8_4_ = -(uint)(auVar77._8_4_ < auVar110._8_4_);
              auVar49._4_4_ = auVar49._8_4_;
              auVar49._0_4_ = auVar49._8_4_;
              auVar49._12_4_ = auVar49._8_4_;
              SVar90 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar110,auVar77,auVar49);
              SVar79 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar77,auVar110,auVar49);
              *pSVar36 = SVar79;
              pSVar36[1] = SVar90;
              uVar44 = auVar88._0_8_;
              pSVar36 = pSVar36 + 2;
            }
            else {
              lVar43 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                }
              }
              auVar50._4_4_ = auVar47._8_4_;
              auVar50._0_4_ = auVar47._8_4_;
              auVar50._8_4_ = auVar47._8_4_;
              auVar50._12_4_ = auVar47._8_4_;
              auVar111 = blendvps(auVar100,auVar78,auVar50);
              auVar77 = blendvps(auVar78,auVar100,auVar50);
              auVar119._8_4_ = tNear.field_0.i[lVar43];
              auVar119._0_8_ = *(undefined8 *)(uVar42 + lVar43 * 8);
              auVar119._12_4_ = 0;
              auVar51._8_4_ = -(uint)(iVar33 < tNear.field_0.i[lVar43]);
              auVar51._4_4_ = auVar51._8_4_;
              auVar51._0_4_ = auVar51._8_4_;
              auVar51._12_4_ = auVar51._8_4_;
              auVar110 = blendvps(auVar119,auVar89,auVar51);
              auVar88 = blendvps(auVar89,auVar119,auVar51);
              auVar52._8_4_ = -(uint)(auVar77._8_4_ < auVar88._8_4_);
              auVar52._4_4_ = auVar52._8_4_;
              auVar52._0_4_ = auVar52._8_4_;
              auVar52._12_4_ = auVar52._8_4_;
              auVar120 = blendvps(auVar88,auVar77,auVar52);
              SVar79 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar77,auVar88,auVar52);
              auVar53._8_4_ = -(uint)(auVar111._8_4_ < auVar110._8_4_);
              auVar53._4_4_ = auVar53._8_4_;
              auVar53._0_4_ = auVar53._8_4_;
              auVar53._12_4_ = auVar53._8_4_;
              auVar77 = blendvps(auVar110,auVar111,auVar53);
              auVar88 = blendvps(auVar111,auVar110,auVar53);
              auVar54._8_4_ = -(uint)(auVar88._8_4_ < auVar120._8_4_);
              auVar54._4_4_ = auVar54._8_4_;
              auVar54._0_4_ = auVar54._8_4_;
              auVar54._12_4_ = auVar54._8_4_;
              SVar90 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar120,auVar88,auVar54);
              SVar112 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar88,auVar120,auVar54);
              *pSVar36 = SVar79;
              pSVar36[1] = SVar112;
              pSVar36[2] = SVar90;
              uVar44 = auVar77._0_8_;
              pSVar36 = pSVar36 + 3;
            }
          }
        }
      }
      uVar42 = (ulong)((uint)uVar44 & 0xf) - 8;
      if (uVar42 != 0) {
        uVar44 = uVar44 & 0xfffffffffffffff0;
        uVar40 = 0;
        local_1228 = uVar42;
        do {
          lVar43 = uVar40 * 0x140;
          fVar85 = *(float *)(ray + k * 4 + 0x70);
          pfVar9 = (float *)(uVar44 + 0x90 + lVar43);
          pfVar1 = (float *)(uVar44 + lVar43);
          pfVar10 = (float *)(uVar44 + 0xa0 + lVar43);
          pfVar8 = (float *)(uVar44 + 0x10 + lVar43);
          pfVar11 = (float *)(uVar44 + 0xb0 + lVar43);
          pfVar2 = (float *)(uVar44 + 0x20 + lVar43);
          pfVar12 = (float *)(uVar44 + 0xc0 + lVar43);
          pfVar3 = (float *)(uVar44 + 0x30 + lVar43);
          pfVar13 = (float *)(uVar44 + 0xd0 + lVar43);
          pfVar4 = (float *)(uVar44 + 0x40 + lVar43);
          pfVar14 = (float *)(uVar44 + 0xe0 + lVar43);
          pfVar5 = (float *)(uVar44 + 0x50 + lVar43);
          pfVar15 = (float *)(uVar44 + 0xf0 + lVar43);
          pfVar6 = (float *)(uVar44 + 0x60 + lVar43);
          pfVar16 = (float *)(uVar44 + 0x100 + lVar43);
          pfVar7 = (float *)(uVar44 + 0x70 + lVar43);
          pfVar17 = (float *)(uVar44 + 0x110 + lVar43);
          pfVar18 = (float *)(uVar44 + 0x80 + lVar43);
          fVar97 = *(float *)(ray + k * 4);
          fVar157 = *(float *)(ray + k * 4 + 0x10);
          fVar141 = *(float *)(ray + k * 4 + 0x20);
          local_1028 = (*pfVar9 * fVar85 + *pfVar1) - fVar97;
          fStack_1024 = (pfVar9[1] * fVar85 + pfVar1[1]) - fVar97;
          fStack_1020 = (pfVar9[2] * fVar85 + pfVar1[2]) - fVar97;
          fStack_101c = (pfVar9[3] * fVar85 + pfVar1[3]) - fVar97;
          fVar147 = (*pfVar10 * fVar85 + *pfVar8) - fVar157;
          fVar148 = (pfVar10[1] * fVar85 + pfVar8[1]) - fVar157;
          fVar149 = (pfVar10[2] * fVar85 + pfVar8[2]) - fVar157;
          fVar150 = (pfVar10[3] * fVar85 + pfVar8[3]) - fVar157;
          fVar159 = (*pfVar11 * fVar85 + *pfVar2) - fVar141;
          fVar160 = (pfVar11[1] * fVar85 + pfVar2[1]) - fVar141;
          fVar161 = (pfVar11[2] * fVar85 + pfVar2[2]) - fVar141;
          fVar162 = (pfVar11[3] * fVar85 + pfVar2[3]) - fVar141;
          fVar151 = (*pfVar12 * fVar85 + *pfVar3) - fVar97;
          fVar66 = (pfVar12[1] * fVar85 + pfVar3[1]) - fVar97;
          fVar67 = (pfVar12[2] * fVar85 + pfVar3[2]) - fVar97;
          fVar68 = (pfVar12[3] * fVar85 + pfVar3[3]) - fVar97;
          fVar107 = (*pfVar13 * fVar85 + *pfVar4) - fVar157;
          fVar114 = (pfVar13[1] * fVar85 + pfVar4[1]) - fVar157;
          fVar115 = (pfVar13[2] * fVar85 + pfVar4[2]) - fVar157;
          fVar116 = (pfVar13[3] * fVar85 + pfVar4[3]) - fVar157;
          fVar142 = (*pfVar14 * fVar85 + *pfVar5) - fVar141;
          fVar143 = (pfVar14[1] * fVar85 + pfVar5[1]) - fVar141;
          fVar144 = (pfVar14[2] * fVar85 + pfVar5[2]) - fVar141;
          fVar145 = (pfVar14[3] * fVar85 + pfVar5[3]) - fVar141;
          fVar86 = (*pfVar15 * fVar85 + *pfVar6) - fVar97;
          fVar93 = (pfVar15[1] * fVar85 + pfVar6[1]) - fVar97;
          fVar95 = (pfVar15[2] * fVar85 + pfVar6[2]) - fVar97;
          fVar97 = (pfVar15[3] * fVar85 + pfVar6[3]) - fVar97;
          fVar152 = (*pfVar16 * fVar85 + *pfVar7) - fVar157;
          fVar155 = (pfVar16[1] * fVar85 + pfVar7[1]) - fVar157;
          fVar156 = (pfVar16[2] * fVar85 + pfVar7[2]) - fVar157;
          fVar157 = (pfVar16[3] * fVar85 + pfVar7[3]) - fVar157;
          fVar69 = (fVar85 * *pfVar17 + *pfVar18) - fVar141;
          fVar75 = (fVar85 * pfVar17[1] + pfVar18[1]) - fVar141;
          fVar76 = (fVar85 * pfVar17[2] + pfVar18[2]) - fVar141;
          fVar141 = (fVar85 * pfVar17[3] + pfVar18[3]) - fVar141;
          fVar131 = fVar86 - local_1028;
          fVar133 = fVar93 - fStack_1024;
          fVar134 = fVar95 - fStack_1020;
          fVar135 = fVar97 - fStack_101c;
          local_1018 = fVar152 - fVar147;
          fStack_1014 = fVar155 - fVar148;
          fStack_1010 = fVar156 - fVar149;
          fStack_100c = fVar157 - fVar150;
          fVar136 = fVar69 - fVar159;
          fVar138 = fVar75 - fVar160;
          fVar139 = fVar76 - fVar161;
          fVar140 = fVar141 - fVar162;
          fVar85 = *(float *)(ray + k * 4 + 0x50);
          local_1038 = *(float *)(ray + k * 4 + 0x60);
          fVar146 = *(float *)(ray + k * 4 + 0x40);
          fVar118 = (local_1018 * (fVar69 + fVar159) - (fVar152 + fVar147) * fVar136) * fVar146 +
                    ((fVar86 + local_1028) * fVar136 - (fVar69 + fVar159) * fVar131) * fVar85 +
                    (fVar131 * (fVar152 + fVar147) - (fVar86 + local_1028) * local_1018) *
                    local_1038;
          fVar123 = (fStack_1014 * (fVar75 + fVar160) - (fVar155 + fVar148) * fVar138) * fVar146 +
                    ((fVar93 + fStack_1024) * fVar138 - (fVar75 + fVar160) * fVar133) * fVar85 +
                    (fVar133 * (fVar155 + fVar148) - (fVar93 + fStack_1024) * fStack_1014) *
                    local_1038;
          local_1088._0_8_ = CONCAT44(fVar123,fVar118);
          local_1088._8_4_ =
               (fStack_1010 * (fVar76 + fVar161) - (fVar156 + fVar149) * fVar139) * fVar146 +
               ((fVar95 + fStack_1020) * fVar139 - (fVar76 + fVar161) * fVar134) * fVar85 +
               (fVar134 * (fVar156 + fVar149) - (fVar95 + fStack_1020) * fStack_1010) * local_1038;
          local_1088._12_4_ =
               (fStack_100c * (fVar141 + fVar162) - (fVar157 + fVar150) * fVar140) * fVar146 +
               ((fVar97 + fStack_101c) * fVar140 - (fVar141 + fVar162) * fVar135) * fVar85 +
               (fVar135 * (fVar157 + fVar150) - (fVar97 + fStack_101c) * fStack_100c) * local_1038;
          fVar158 = local_1028 - fVar151;
          fVar102 = fStack_1024 - fVar66;
          fVar163 = fStack_1020 - fVar67;
          fVar105 = fStack_101c - fVar68;
          fVar126 = fVar147 - fVar107;
          fVar128 = fVar148 - fVar114;
          fVar129 = fVar149 - fVar115;
          fVar130 = fVar150 - fVar116;
          local_1048 = fVar159 - fVar142;
          fStack_1044 = fVar160 - fVar143;
          fStack_1040 = fVar161 - fVar144;
          fStack_103c = fVar162 - fVar145;
          local_1078._0_4_ =
               (fVar126 * (fVar159 + fVar142) - (fVar147 + fVar107) * local_1048) * fVar146 +
               ((local_1028 + fVar151) * local_1048 - (fVar159 + fVar142) * fVar158) * fVar85 +
               (fVar158 * (fVar147 + fVar107) - (local_1028 + fVar151) * fVar126) * local_1038;
          local_1078._4_4_ =
               (fVar128 * (fVar160 + fVar143) - (fVar148 + fVar114) * fStack_1044) * fVar146 +
               ((fStack_1024 + fVar66) * fStack_1044 - (fVar160 + fVar143) * fVar102) * fVar85 +
               (fVar102 * (fVar148 + fVar114) - (fStack_1024 + fVar66) * fVar128) * local_1038;
          local_1078._8_4_ =
               (fVar129 * (fVar161 + fVar144) - (fVar149 + fVar115) * fStack_1040) * fVar146 +
               ((fStack_1020 + fVar67) * fStack_1040 - (fVar161 + fVar144) * fVar163) * fVar85 +
               (fVar163 * (fVar149 + fVar115) - (fStack_1020 + fVar67) * fVar129) * local_1038;
          local_1078._12_4_ =
               (fVar130 * (fVar162 + fVar145) - (fVar150 + fVar116) * fStack_103c) * fVar146 +
               ((fStack_101c + fVar68) * fStack_103c - (fVar162 + fVar145) * fVar105) * fVar85 +
               (fVar105 * (fVar150 + fVar116) - (fStack_101c + fVar68) * fVar130) * local_1038;
          fVar99 = fVar151 - fVar86;
          fVar103 = fVar66 - fVar93;
          fVar104 = fVar67 - fVar95;
          fVar106 = fVar68 - fVar97;
          local_1058 = fVar107 - fVar152;
          fStack_1054 = fVar114 - fVar155;
          fStack_1050 = fVar115 - fVar156;
          fStack_104c = fVar116 - fVar157;
          local_1068 = fVar142 - fVar69;
          fStack_1064 = fVar143 - fVar75;
          fStack_1060 = fVar144 - fVar76;
          fStack_105c = fVar145 - fVar141;
          fStack_1034 = local_1038;
          fStack_1030 = local_1038;
          fStack_102c = local_1038;
          auVar80._0_4_ =
               (local_1058 * (fVar69 + fVar142) - (fVar152 + fVar107) * local_1068) * fVar146 +
               ((fVar86 + fVar151) * local_1068 - (fVar69 + fVar142) * fVar99) * fVar85 +
               (fVar99 * (fVar152 + fVar107) - (fVar86 + fVar151) * local_1058) * local_1038;
          auVar80._4_4_ =
               (fStack_1054 * (fVar75 + fVar143) - (fVar155 + fVar114) * fStack_1064) * fVar146 +
               ((fVar93 + fVar66) * fStack_1064 - (fVar75 + fVar143) * fVar103) * fVar85 +
               (fVar103 * (fVar155 + fVar114) - (fVar93 + fVar66) * fStack_1054) * local_1038;
          auVar80._8_4_ =
               (fStack_1050 * (fVar76 + fVar144) - (fVar156 + fVar115) * fStack_1060) * fVar146 +
               ((fVar95 + fVar67) * fStack_1060 - (fVar76 + fVar144) * fVar104) * fVar85 +
               (fVar104 * (fVar156 + fVar115) - (fVar95 + fVar67) * fStack_1050) * local_1038;
          auVar80._12_4_ =
               (fStack_104c * (fVar141 + fVar145) - (fVar157 + fVar116) * fStack_105c) * fVar146 +
               ((fVar97 + fVar68) * fStack_105c - (fVar141 + fVar145) * fVar106) * fVar85 +
               (fVar106 * (fVar157 + fVar116) - (fVar97 + fVar68) * fStack_104c) * local_1038;
          local_1098 = fVar118 + local_1078._0_4_ + auVar80._0_4_;
          fStack_1094 = fVar123 + local_1078._4_4_ + auVar80._4_4_;
          fStack_1090 = local_1088._8_4_ + local_1078._8_4_ + auVar80._8_4_;
          fStack_108c = local_1088._12_4_ + local_1078._12_4_ + auVar80._12_4_;
          auVar55._8_4_ = local_1088._8_4_;
          auVar55._0_8_ = local_1088._0_8_;
          auVar55._12_4_ = local_1088._12_4_;
          auVar56 = minps(auVar55,local_1078);
          auVar56 = minps(auVar56,auVar80);
          auVar153._8_4_ = local_1088._8_4_;
          auVar153._0_8_ = local_1088._0_8_;
          auVar153._12_4_ = local_1088._12_4_;
          auVar77 = maxps(auVar153,local_1078);
          auVar77 = maxps(auVar77,auVar80);
          fVar97 = ABS(local_1098) * 1.1920929e-07;
          fVar157 = ABS(fStack_1094) * 1.1920929e-07;
          fVar141 = ABS(fStack_1090) * 1.1920929e-07;
          fVar151 = ABS(fStack_108c) * 1.1920929e-07;
          auVar154._4_4_ = -(uint)(auVar77._4_4_ <= fVar157);
          auVar154._0_4_ = -(uint)(auVar77._0_4_ <= fVar97);
          auVar154._8_4_ = -(uint)(auVar77._8_4_ <= fVar141);
          auVar154._12_4_ = -(uint)(auVar77._12_4_ <= fVar151);
          auVar57._4_4_ = -(uint)(-fVar157 <= auVar56._4_4_);
          auVar57._0_4_ = -(uint)(-fVar97 <= auVar56._0_4_);
          auVar57._8_4_ = -(uint)(-fVar141 <= auVar56._8_4_);
          auVar57._12_4_ = -(uint)(-fVar151 <= auVar56._12_4_);
          auVar154 = auVar154 | auVar57;
          uVar38 = movmskps((int)uVar42,auVar154);
          uVar42 = (ulong)uVar38;
          if (uVar38 != 0) {
            auVar121._0_4_ = local_1018 * local_1048 - fVar126 * fVar136;
            auVar121._4_4_ = fStack_1014 * fStack_1044 - fVar128 * fVar138;
            auVar121._8_4_ = fStack_1010 * fStack_1040 - fVar129 * fVar139;
            auVar121._12_4_ = fStack_100c * fStack_103c - fVar130 * fVar140;
            auVar127._0_4_ = fVar126 * local_1068 - local_1058 * local_1048;
            auVar127._4_4_ = fVar128 * fStack_1064 - fStack_1054 * fStack_1044;
            auVar127._8_4_ = fVar129 * fStack_1060 - fStack_1050 * fStack_1040;
            auVar127._12_4_ = fVar130 * fStack_105c - fStack_104c * fStack_103c;
            uVar87 = (uint)DAT_01f7b6c0;
            uVar94 = DAT_01f7b6c0._4_4_;
            uVar96 = DAT_01f7b6c0._8_4_;
            uVar98 = DAT_01f7b6c0._12_4_;
            auVar58._4_4_ =
                 -(uint)((float)((uint)(fVar128 * fVar138) & uVar94) <
                        (float)((uint)(fStack_1054 * fStack_1044) & uVar94));
            auVar58._0_4_ =
                 -(uint)((float)((uint)(fVar126 * fVar136) & uVar87) <
                        (float)((uint)(local_1058 * local_1048) & uVar87));
            auVar58._8_4_ =
                 -(uint)((float)((uint)(fVar129 * fVar139) & uVar96) <
                        (float)((uint)(fStack_1050 * fStack_1040) & uVar96));
            auVar58._12_4_ =
                 -(uint)((float)((uint)(fVar130 * fVar140) & uVar98) <
                        (float)((uint)(fStack_104c * fStack_103c) & uVar98));
            local_1148 = blendvps(auVar127,auVar121,auVar58);
            auVar137._0_4_ = fVar99 * local_1048 - fVar158 * local_1068;
            auVar137._4_4_ = fVar103 * fStack_1044 - fVar102 * fStack_1064;
            auVar137._8_4_ = fVar104 * fStack_1040 - fVar163 * fStack_1060;
            auVar137._12_4_ = fVar106 * fStack_103c - fVar105 * fStack_105c;
            auVar59._4_4_ =
                 -(uint)((float)((uint)(fVar133 * fStack_1044) & uVar94) <
                        (float)((uint)(fVar102 * fStack_1064) & uVar94));
            auVar59._0_4_ =
                 -(uint)((float)((uint)(fVar131 * local_1048) & uVar87) <
                        (float)((uint)(fVar158 * local_1068) & uVar87));
            auVar59._8_4_ =
                 -(uint)((float)((uint)(fVar134 * fStack_1040) & uVar96) <
                        (float)((uint)(fVar163 * fStack_1060) & uVar96));
            auVar59._12_4_ =
                 -(uint)((float)((uint)(fVar135 * fStack_103c) & uVar98) <
                        (float)((uint)(fVar105 * fStack_105c) & uVar98));
            auVar28._4_4_ = fVar138 * fVar102 - fVar133 * fStack_1044;
            auVar28._0_4_ = fVar136 * fVar158 - fVar131 * local_1048;
            auVar28._8_4_ = fVar139 * fVar163 - fVar134 * fStack_1040;
            auVar28._12_4_ = fVar140 * fVar105 - fVar135 * fStack_103c;
            local_1138 = blendvps(auVar137,auVar28,auVar59);
            auVar125._0_4_ = fVar131 * fVar126 - fVar158 * local_1018;
            auVar125._4_4_ = fVar133 * fVar128 - fVar102 * fStack_1014;
            auVar125._8_4_ = fVar134 * fVar129 - fVar163 * fStack_1010;
            auVar125._12_4_ = fVar135 * fVar130 - fVar105 * fStack_100c;
            auVar132._0_4_ = fVar158 * local_1058 - fVar99 * fVar126;
            auVar132._4_4_ = fVar102 * fStack_1054 - fVar103 * fVar128;
            auVar132._8_4_ = fVar163 * fStack_1050 - fVar104 * fVar129;
            auVar132._12_4_ = fVar105 * fStack_104c - fVar106 * fVar130;
            auVar60._4_4_ =
                 -(uint)((float)((uint)(fVar102 * fStack_1014) & uVar94) <
                        (float)((uint)(fVar103 * fVar128) & uVar94));
            auVar60._0_4_ =
                 -(uint)((float)((uint)(fVar158 * local_1018) & uVar87) <
                        (float)((uint)(fVar99 * fVar126) & uVar87));
            auVar60._8_4_ =
                 -(uint)((float)((uint)(fVar163 * fStack_1010) & uVar96) <
                        (float)((uint)(fVar104 * fVar129) & uVar96));
            auVar60._12_4_ =
                 -(uint)((float)((uint)(fVar105 * fStack_100c) & uVar98) <
                        (float)((uint)(fVar106 * fVar130) & uVar98));
            local_1128 = blendvps(auVar132,auVar125,auVar60);
            fVar97 = fVar146 * local_1148._0_4_ +
                     fVar85 * local_1138._0_4_ + local_1038 * local_1128._0_4_;
            fVar157 = fVar146 * local_1148._4_4_ +
                      fVar85 * local_1138._4_4_ + local_1038 * local_1128._4_4_;
            fVar141 = fVar146 * local_1148._8_4_ +
                      fVar85 * local_1138._8_4_ + local_1038 * local_1128._8_4_;
            fVar85 = fVar146 * local_1148._12_4_ +
                     fVar85 * local_1138._12_4_ + local_1038 * local_1128._12_4_;
            auVar81._0_4_ = fVar97 + fVar97;
            auVar81._4_4_ = fVar157 + fVar157;
            auVar81._8_4_ = fVar141 + fVar141;
            auVar81._12_4_ = fVar85 + fVar85;
            auVar61._0_4_ = fVar147 * local_1138._0_4_ + fVar159 * local_1128._0_4_;
            auVar61._4_4_ = fVar148 * local_1138._4_4_ + fVar160 * local_1128._4_4_;
            auVar61._8_4_ = fVar149 * local_1138._8_4_ + fVar161 * local_1128._8_4_;
            auVar61._12_4_ = fVar150 * local_1138._12_4_ + fVar162 * local_1128._12_4_;
            fVar146 = local_1028 * local_1148._0_4_ + auVar61._0_4_;
            fVar151 = fStack_1024 * local_1148._4_4_ + auVar61._4_4_;
            fVar66 = fStack_1020 * local_1148._8_4_ + auVar61._8_4_;
            fVar67 = fStack_101c * local_1148._12_4_ + auVar61._12_4_;
            auVar56 = rcpps(auVar61,auVar81);
            fVar85 = auVar56._0_4_;
            fVar97 = auVar56._4_4_;
            fVar157 = auVar56._8_4_;
            fVar141 = auVar56._12_4_;
            fVar146 = ((1.0 - auVar81._0_4_ * fVar85) * fVar85 + fVar85) * (fVar146 + fVar146);
            fVar151 = ((1.0 - auVar81._4_4_ * fVar97) * fVar97 + fVar97) * (fVar151 + fVar151);
            fVar157 = ((1.0 - auVar81._8_4_ * fVar157) * fVar157 + fVar157) * (fVar66 + fVar66);
            fVar141 = ((1.0 - auVar81._12_4_ * fVar141) * fVar141 + fVar141) * (fVar67 + fVar67);
            fVar97 = *(float *)(ray + k * 4 + 0x80);
            fVar85 = *(float *)(ray + k * 4 + 0x30);
            auVar70._4_4_ = -(uint)(fVar85 <= fVar151);
            auVar70._0_4_ = -(uint)(fVar85 <= fVar146);
            auVar70._8_4_ = -(uint)(fVar85 <= fVar157);
            auVar70._12_4_ = -(uint)(fVar85 <= fVar141);
            auVar62._0_4_ = -(uint)(fVar146 <= fVar97 && fVar85 <= fVar146) & auVar154._0_4_;
            auVar62._4_4_ = -(uint)(fVar151 <= fVar97 && fVar85 <= fVar151) & auVar154._4_4_;
            auVar62._8_4_ = -(uint)(fVar157 <= fVar97 && fVar85 <= fVar157) & auVar154._8_4_;
            auVar62._12_4_ = -(uint)(fVar141 <= fVar97 && fVar85 <= fVar141) & auVar154._12_4_;
            uVar38 = movmskps(uVar38,auVar62);
            uVar42 = (ulong)uVar38;
            if (uVar38 != 0) {
              valid.field_0.i[0] = auVar62._0_4_ & -(uint)(auVar81._0_4_ != 0.0);
              valid.field_0.i[1] = auVar62._4_4_ & -(uint)(auVar81._4_4_ != 0.0);
              valid.field_0.i[2] = auVar62._8_4_ & -(uint)(auVar81._8_4_ != 0.0);
              valid.field_0.i[3] = auVar62._12_4_ & -(uint)(auVar81._12_4_ != 0.0);
              uVar38 = movmskps(uVar38,(undefined1  [16])valid.field_0);
              uVar42 = (ulong)uVar38;
              if (uVar38 != 0) {
                tNear.field_0.v[2] = local_1088._8_4_;
                tNear.field_0._0_8_ = local_1088._0_8_;
                tNear.field_0.v[3] = local_1088._12_4_;
                auVar31._4_4_ = fStack_1094;
                auVar31._0_4_ = local_1098;
                auVar31._8_4_ = fStack_1090;
                auVar31._12_4_ = fStack_108c;
                local_1158[0] = fVar146;
                local_1158[1] = fVar151;
                local_1158[2] = fVar157;
                local_1158[3] = fVar141;
                pSVar21 = context->scene;
                auVar56 = rcpps(auVar70,auVar31);
                fVar85 = auVar56._0_4_;
                fVar66 = auVar56._4_4_;
                fVar67 = auVar56._8_4_;
                fVar68 = auVar56._12_4_;
                fVar85 = (float)(-(uint)(1e-18 <= ABS(local_1098)) &
                                (uint)(((float)DAT_01f7ba10 - local_1098 * fVar85) * fVar85 + fVar85
                                      ));
                fVar66 = (float)(-(uint)(1e-18 <= ABS(fStack_1094)) &
                                (uint)((DAT_01f7ba10._4_4_ - fStack_1094 * fVar66) * fVar66 + fVar66
                                      ));
                fVar67 = (float)(-(uint)(1e-18 <= ABS(fStack_1090)) &
                                (uint)((DAT_01f7ba10._8_4_ - fStack_1090 * fVar67) * fVar67 + fVar67
                                      ));
                fVar68 = (float)(-(uint)(1e-18 <= ABS(fStack_108c)) &
                                (uint)((DAT_01f7ba10._12_4_ - fStack_108c * fVar68) * fVar68 +
                                      fVar68));
                auVar122._0_4_ = fVar118 * fVar85;
                auVar122._4_4_ = fVar123 * fVar66;
                auVar122._8_4_ = local_1088._8_4_ * fVar67;
                auVar122._12_4_ = local_1088._12_4_ * fVar68;
                local_1178 = minps(auVar122,_DAT_01f7ba10);
                auVar113._0_4_ = fVar85 * local_1078._0_4_;
                auVar113._4_4_ = fVar66 * local_1078._4_4_;
                auVar113._8_4_ = fVar67 * local_1078._8_4_;
                auVar113._12_4_ = fVar68 * local_1078._12_4_;
                local_1168 = minps(auVar113,_DAT_01f7ba10);
                auVar29._4_4_ = fVar151;
                auVar29._0_4_ = fVar146;
                auVar29._8_4_ = fVar157;
                auVar29._12_4_ = fVar141;
                auVar77 = blendvps(_DAT_01f7a9f0,auVar29,(undefined1  [16])valid.field_0);
                auVar91._4_4_ = auVar77._0_4_;
                auVar91._0_4_ = auVar77._4_4_;
                auVar91._8_4_ = auVar77._12_4_;
                auVar91._12_4_ = auVar77._8_4_;
                auVar56 = minps(auVar91,auVar77);
                auVar71._0_8_ = auVar56._8_8_;
                auVar71._8_4_ = auVar56._0_4_;
                auVar71._12_4_ = auVar56._4_4_;
                auVar56 = minps(auVar71,auVar56);
                uVar38 = -(uint)(auVar56._0_4_ == auVar77._0_4_);
                uVar87 = -(uint)(auVar56._4_4_ == auVar77._4_4_);
                uVar94 = -(uint)(auVar56._8_4_ == auVar77._8_4_);
                uVar96 = -(uint)(auVar56._12_4_ == auVar77._12_4_);
                auVar84._4_4_ = uVar87;
                auVar84._0_4_ = uVar38;
                auVar82._0_4_ = uVar38 & valid.field_0.i[0];
                auVar82._4_4_ = uVar87 & valid.field_0.i[1];
                auVar82._8_4_ = uVar94 & valid.field_0.i[2];
                auVar82._12_4_ = uVar96 & valid.field_0.i[3];
                iVar33 = movmskps((int)context,auVar82);
                auVar83._8_4_ = 0xffffffff;
                auVar83._0_8_ = 0xffffffffffffffff;
                auVar83._12_4_ = 0xffffffff;
                if (iVar33 != 0) {
                  auVar84._8_4_ = uVar94;
                  auVar84._12_4_ = uVar96;
                  auVar83 = auVar84;
                }
                lVar43 = lVar43 + uVar44;
                auVar63._0_4_ = valid.field_0.i[0] & auVar83._0_4_;
                auVar63._4_4_ = valid.field_0.i[1] & auVar83._4_4_;
                auVar63._8_4_ = valid.field_0.i[2] & auVar83._8_4_;
                auVar63._12_4_ = valid.field_0.i[3] & auVar83._12_4_;
                uVar34 = movmskps(iVar33,auVar63);
                uVar42 = CONCAT44((int)((ulong)context >> 0x20),uVar34);
                lVar37 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                  }
                }
LAB_0025f361:
                uVar38 = *(uint *)(lVar43 + 0x120 + lVar37 * 4);
                pGVar22 = (pSVar21->geometries).items[uVar38].ptr;
                if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar37] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar34 = *(undefined4 *)(local_1178 + lVar37 * 4);
                    fVar85 = local_1158[lVar37 + -4];
                    *(float *)(ray + k * 4 + 0x80) = local_1158[lVar37];
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1148 + lVar37 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1138 + lVar37 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1128 + lVar37 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar34;
                    *(float *)(ray + k * 4 + 0x100) = fVar85;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)(lVar43 + 0x130 + lVar37 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar38;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar38 = context->user->instPrimID[0];
                    uVar42 = (ulong)uVar38;
                    *(uint *)(ray + k * 4 + 0x140) = uVar38;
                    goto LAB_0025f852;
                  }
                  local_fd8 = *(undefined4 *)(local_1178 + lVar37 * 4);
                  local_fc8 = local_1158[lVar37 + -4];
                  uVar34 = *(undefined4 *)(local_1148 + lVar37 * 4);
                  uVar35 = *(undefined4 *)(local_1138 + lVar37 * 4);
                  local_fa8._4_4_ = uVar38;
                  local_fa8._0_4_ = uVar38;
                  local_fa8._8_4_ = uVar38;
                  local_fa8._12_4_ = uVar38;
                  uVar19 = *(undefined4 *)(lVar43 + 0x130 + lVar37 * 4);
                  local_fb8._4_4_ = uVar19;
                  local_fb8._0_4_ = uVar19;
                  local_fb8._8_4_ = uVar19;
                  local_fb8._12_4_ = uVar19;
                  local_ff8._4_4_ = uVar35;
                  local_ff8._0_4_ = uVar35;
                  local_ff8._8_4_ = uVar35;
                  local_ff8._12_4_ = uVar35;
                  uVar35 = *(undefined4 *)(local_1128 + lVar37 * 4);
                  local_fe8._4_4_ = uVar35;
                  local_fe8._0_4_ = uVar35;
                  local_fe8._8_4_ = uVar35;
                  local_fe8._12_4_ = uVar35;
                  local_1008[0] = (RTCHitN)(char)uVar34;
                  local_1008[1] = (RTCHitN)(char)((uint)uVar34 >> 8);
                  local_1008[2] = (RTCHitN)(char)((uint)uVar34 >> 0x10);
                  local_1008[3] = (RTCHitN)(char)((uint)uVar34 >> 0x18);
                  local_1008[4] = (RTCHitN)(char)uVar34;
                  local_1008[5] = (RTCHitN)(char)((uint)uVar34 >> 8);
                  local_1008[6] = (RTCHitN)(char)((uint)uVar34 >> 0x10);
                  local_1008[7] = (RTCHitN)(char)((uint)uVar34 >> 0x18);
                  local_1008[8] = (RTCHitN)(char)uVar34;
                  local_1008[9] = (RTCHitN)(char)((uint)uVar34 >> 8);
                  local_1008[10] = (RTCHitN)(char)((uint)uVar34 >> 0x10);
                  local_1008[0xb] = (RTCHitN)(char)((uint)uVar34 >> 0x18);
                  local_1008[0xc] = (RTCHitN)(char)uVar34;
                  local_1008[0xd] = (RTCHitN)(char)((uint)uVar34 >> 8);
                  local_1008[0xe] = (RTCHitN)(char)((uint)uVar34 >> 0x10);
                  local_1008[0xf] = (RTCHitN)(char)((uint)uVar34 >> 0x18);
                  uStack_fd4 = local_fd8;
                  uStack_fd0 = local_fd8;
                  uStack_fcc = local_fd8;
                  fStack_fc4 = local_fc8;
                  fStack_fc0 = local_fc8;
                  fStack_fbc = local_fc8;
                  local_f98 = context->user->instID[0];
                  uStack_f94 = local_f98;
                  uStack_f90 = local_f98;
                  uStack_f8c = local_f98;
                  local_f88 = context->user->instPrimID[0];
                  uStack_f84 = local_f88;
                  uStack_f80 = local_f88;
                  uStack_f7c = local_f88;
                  *(float *)(ray + k * 4 + 0x80) = local_1158[lVar37];
                  local_1248 = *local_1230;
                  args.valid = (int *)local_1248;
                  args.geometryUserPtr = pGVar22->userPtr;
                  args.context = context->user;
                  args.hit = local_1008;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar22->intersectionFilterN)(&args);
                  }
                  if (local_1248 == (undefined1  [16])0x0) {
                    auVar72._8_4_ = 0xffffffff;
                    auVar72._0_8_ = 0xffffffffffffffff;
                    auVar72._12_4_ = 0xffffffff;
                    auVar72 = auVar72 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var23 = context->args->filter;
                    if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var23)(&args);
                    }
                    auVar64._0_4_ = -(uint)(local_1248._0_4_ == 0);
                    auVar64._4_4_ = -(uint)(local_1248._4_4_ == 0);
                    auVar64._8_4_ = -(uint)(local_1248._8_4_ == 0);
                    auVar64._12_4_ = -(uint)(local_1248._12_4_ == 0);
                    auVar72 = auVar64 ^ _DAT_01f7ae20;
                    if (local_1248 != (undefined1  [16])0x0) {
                      auVar56 = blendvps(*(undefined1 (*) [16])args.hit,
                                         *(undefined1 (*) [16])(args.ray + 0xc0),auVar64);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar56;
                      auVar56 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                         *(undefined1 (*) [16])(args.ray + 0xd0),auVar64);
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar56;
                      auVar56 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                         *(undefined1 (*) [16])(args.ray + 0xe0),auVar64);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar56;
                      auVar56 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                         *(undefined1 (*) [16])(args.ray + 0xf0),auVar64);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar56;
                      auVar56 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                         *(undefined1 (*) [16])(args.ray + 0x100),auVar64);
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar56;
                      auVar56 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                         *(undefined1 (*) [16])(args.ray + 0x110),auVar64);
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar56;
                      auVar56 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                         *(undefined1 (*) [16])(args.ray + 0x120),auVar64);
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar56;
                      auVar56 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                         *(undefined1 (*) [16])(args.ray + 0x130),auVar64);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar56;
                      auVar56 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                         *(undefined1 (*) [16])(args.ray + 0x140),auVar64);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar56;
                    }
                  }
                  if ((_DAT_01f7bb20 & auVar72) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar97;
                  }
                  else {
                    fVar97 = *(float *)(ray + k * 4 + 0x80);
                  }
                  valid.field_0.v[lVar37] = 0.0;
                  valid.field_0.i[0] = -(uint)(fVar146 <= fVar97) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar151 <= fVar97) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar157 <= fVar97) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar141 <= fVar97) & valid.field_0.i[3];
                }
                uVar34 = (undefined4)((ulong)lVar37 >> 0x20);
                iVar33 = movmskps((int)lVar37,(undefined1  [16])valid.field_0);
                uVar42 = CONCAT44(uVar34,iVar33);
                if (iVar33 == 0) goto LAB_0025f852;
                auVar30._4_4_ = fVar151;
                auVar30._0_4_ = fVar146;
                auVar30._8_4_ = fVar157;
                auVar30._12_4_ = fVar141;
                auVar77 = blendvps(_DAT_01f7a9f0,auVar30,(undefined1  [16])valid.field_0);
                auVar92._4_4_ = auVar77._0_4_;
                auVar92._0_4_ = auVar77._4_4_;
                auVar92._8_4_ = auVar77._12_4_;
                auVar92._12_4_ = auVar77._8_4_;
                auVar56 = minps(auVar92,auVar77);
                auVar73._0_8_ = auVar56._8_8_;
                auVar73._8_4_ = auVar56._0_4_;
                auVar73._12_4_ = auVar56._4_4_;
                auVar56 = minps(auVar73,auVar56);
                auVar74._0_8_ =
                     CONCAT44(-(uint)(auVar56._4_4_ == auVar77._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar56._0_4_ == auVar77._0_4_) & valid.field_0._0_4_);
                auVar74._8_4_ = -(uint)(auVar56._8_4_ == auVar77._8_4_) & valid.field_0._8_4_;
                auVar74._12_4_ = -(uint)(auVar56._12_4_ == auVar77._12_4_) & valid.field_0._12_4_;
                iVar33 = movmskps(iVar33,auVar74);
                aVar65 = valid.field_0;
                if (iVar33 != 0) {
                  aVar65.i[2] = auVar74._8_4_;
                  aVar65._0_8_ = auVar74._0_8_;
                  aVar65.i[3] = auVar74._12_4_;
                }
                uVar35 = movmskps(iVar33,(undefined1  [16])aVar65);
                uVar42 = CONCAT44(uVar34,uVar35);
                lVar37 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                  }
                }
                goto LAB_0025f361;
              }
            }
          }
LAB_0025f852:
          uVar40 = uVar40 + 1;
        } while (uVar40 != local_1228);
      }
      uVar34 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar56._4_4_ = uVar34;
      auVar56._0_4_ = uVar34;
      auVar56._8_4_ = uVar34;
      auVar56._12_4_ = uVar34;
      fVar66 = local_10d8;
      fVar67 = fStack_10d4;
      fVar68 = fStack_10d0;
      fVar141 = fStack_10cc;
      fVar69 = local_10e8;
      fVar75 = fStack_10e4;
      fVar76 = fStack_10e0;
      fVar146 = fStack_10dc;
      fVar86 = local_1108;
      fVar93 = fStack_1104;
      fVar95 = fStack_1100;
      fVar158 = fStack_10fc;
      fVar99 = local_1118;
      fVar102 = fStack_1114;
      fVar103 = fStack_1110;
      fVar163 = fStack_110c;
      fVar104 = local_10a8;
      fVar105 = fStack_10a4;
      fVar106 = fStack_10a0;
      fVar85 = fStack_109c;
      fVar107 = local_10b8;
      fVar114 = fStack_10b4;
      fVar115 = fStack_10b0;
      fVar97 = fStack_10ac;
      fVar116 = local_10c8;
      fVar118 = fStack_10c4;
      fVar123 = fStack_10c0;
      fVar157 = fStack_10bc;
      fVar126 = local_10f8;
      fVar128 = fStack_10f4;
      fVar129 = fStack_10f0;
      fVar151 = fStack_10ec;
    }
    if (pSVar36 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }